

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall FIX::Message::Message(Message *this)

{
  long *plVar1;
  void *pvVar2;
  atomic<long> *counter;
  message_order local_38;
  
  local_38.m_mode = normal;
  local_38.m_delim = 0;
  local_38.m_groupOrder.m_size._0_4_ = 0;
  local_38.m_groupOrder.m_size._4_4_ = 0;
  local_38.m_groupOrder.m_buffer._0_4_ = 0;
  local_38.m_groupOrder.m_buffer._4_4_ = 0;
  local_38.m_largest = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_38);
  plVar1 = (long *)CONCAT44(local_38.m_groupOrder.m_buffer._4_4_,
                            local_38.m_groupOrder.m_buffer._0_4_);
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pvVar2 = (void *)CONCAT44(local_38.m_groupOrder.m_buffer._4_4_,
                                local_38.m_groupOrder.m_buffer._0_4_);
      local_38.m_groupOrder.m_size._0_4_ = 0;
      local_38.m_groupOrder.m_size._4_4_ = 0;
      local_38.m_groupOrder.m_buffer._0_4_ = 0;
      local_38.m_groupOrder.m_buffer._4_4_ = 0;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
  }
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001f6428;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  return;
}

Assistant:

Message::Message()
    : m_validStructure(true),
      m_tag(0) {}